

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint adler32(uchar *data,uint len)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  
  if (len != 0) {
    uVar2 = 1;
    uVar1 = 0;
    do {
      uVar4 = 0x15ae;
      if (len < 0x15ae) {
        uVar4 = len;
      }
      uVar3 = len;
      if (0x15ad < len) {
        uVar3 = 0x15ae;
      }
      lVar5 = 0;
      do {
        uVar2 = uVar2 + data[lVar5];
        uVar1 = uVar1 + uVar2;
        lVar5 = lVar5 + 1;
      } while (uVar3 != (uint)lVar5);
      uVar2 = uVar2 % 0xfff1;
      uVar1 = uVar1 % 0xfff1;
      data = data + (ulong)(uVar4 - 1) + 1;
      len = len - uVar4;
    } while (len != 0);
    return uVar1 << 0x10 | uVar2;
  }
  return 1;
}

Assistant:

static unsigned update_adler32(unsigned adler, const unsigned char* data, unsigned len)
{
	unsigned s1 = adler & 0xffff;
	unsigned s2 = (adler >> 16) & 0xffff;

	while (len > 0)
	{
		/*at least 5550 sums can be done before the sums overflow, saving a lot of module divisions*/
		unsigned amount = len > 5550 ? 5550 : len;
		len -= amount;
		while (amount > 0)
		{
			s1 += (*data++);
			s2 += s1;
			--amount;
		}
		s1 %= 65521;
		s2 %= 65521;
	}

	return (s2 << 16) | s1;
}